

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformdialoghelper.h
# Opt level: O1

void __thiscall
QPlatformMessageDialogHelper::~QPlatformMessageDialogHelper(QPlatformMessageDialogHelper *this)

{
  *(undefined ***)this = &PTR_metaObject_007e6ea8;
  QSharedPointer<QMessageDialogOptions>::deref(*(Data **)(this + 0x18));
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

class Q_GUI_EXPORT QPlatformMessageDialogHelper : public QPlatformDialogHelper
{
    Q_OBJECT
public:
    const QSharedPointer<QMessageDialogOptions> &options() const;
    void setOptions(const QSharedPointer<QMessageDialogOptions> &options);

Q_SIGNALS:
    void clicked(QPlatformDialogHelper::StandardButton button, QPlatformDialogHelper::ButtonRole role);
    void checkBoxStateChanged(Qt::CheckState state);

private:
    QSharedPointer<QMessageDialogOptions> m_options;
}